

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

FeatureVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies
          (FeatureVector *__return_storage_ptr__,Feature feature)

{
  undefined8 uVar1;
  Feature *arg_list_end;
  undefined8 local_28;
  Feature aFStack_20 [4];
  Feature local_10 [2];
  
  switch(feature) {
  case SubgroupAllEqualT:
    uVar1 = 0x700000005;
    arg_list_end = aFStack_20;
    goto LAB_0025ae7b;
  case SubgroupElect:
    arg_list_end = aFStack_20 + 1;
    local_28 = 0xc00000006;
    aFStack_20[0] = 2;
    break;
  default:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
         0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         (Feature *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 8;
    return __return_storage_ptr__;
  case SubgroupInverseBallot_InclBitCount_ExclBitCout:
    arg_list_end = (Feature *)((long)&local_28 + 4);
    local_28 = (ulong)local_28._4_4_ << 0x20;
    break;
  case SubgroupBallotBitCount:
    arg_list_end = (Feature *)((long)&local_28 + 4);
    local_28 = CONCAT44(local_28._4_4_,0xc);
    break;
  case SubgroupArithmeticIAddReduce:
  case SubgroupArithmeticIAddInclusiveScan:
  case SubgroupArithmeticFAddReduce:
  case SubgroupArithmeticFAddInclusiveScan:
  case SubgroupArithmeticIMulReduce:
  case SubgroupArithmeticIMulInclusiveScan:
  case SubgroupArithmeticFMulReduce:
  case SubgroupArithmeticFMulInclusiveScan:
    arg_list_end = aFStack_20 + 3;
    local_28 = 0xc00000001;
    aFStack_20[0] = SubgroupBallotBitCount;
    aFStack_20[1] = SubgroupMask;
    aFStack_20[2] = 0xe;
    break;
  case SubgroupArithmeticIAddExclusiveScan:
  case SubgroupArithmeticFAddExclusiveScan:
  case SubgroupArithmeticIMulExclusiveScan:
  case SubgroupArithmeticFMulExclusiveScan:
    arg_list_end = local_10;
    local_28 = 0xc00000001;
    aFStack_20[0] = SubgroupBallotBitCount;
    aFStack_20[1] = SubgroupMask;
    uVar1 = 0xe00000009;
LAB_0025ae7b:
    *(undefined8 *)(arg_list_end + -2) = uVar1;
  }
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>
            (__return_storage_ptr__,(Feature *)&local_28,arg_list_end);
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_feature_dependencies(Feature feature)
{
	switch (feature)
	{
	case SubgroupAllEqualT:
		return { SubgroupBroadcast_First, SubgroupAll_Any_AllEqualBool };
	case SubgroupElect:
		return { SubgroupBallotFindLSB_MSB, SubgroupBallot, SubgroupInvocationID };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return { SubgroupMask };
	case SubgroupBallotBitCount:
		return { SubgroupBallot };
	case SubgroupArithmeticIAddReduce:
	case SubgroupArithmeticIAddInclusiveScan:
	case SubgroupArithmeticFAddReduce:
	case SubgroupArithmeticFAddInclusiveScan:
	case SubgroupArithmeticIMulReduce:
	case SubgroupArithmeticIMulInclusiveScan:
	case SubgroupArithmeticFMulReduce:
	case SubgroupArithmeticFMulInclusiveScan:
		return { SubgroupSize, SubgroupBallot, SubgroupBallotBitCount, SubgroupMask, SubgroupBallotBitExtract };
	case SubgroupArithmeticIAddExclusiveScan:
	case SubgroupArithmeticFAddExclusiveScan:
	case SubgroupArithmeticIMulExclusiveScan:
	case SubgroupArithmeticFMulExclusiveScan:
		return { SubgroupSize, SubgroupBallot, SubgroupBallotBitCount,
			     SubgroupMask, SubgroupElect,  SubgroupBallotBitExtract };
	default:
		return {};
	}
}